

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_adaptor_encrypt
              (secp256k1_context *ctx,uchar *adaptor_sig162,uchar *seckey32,secp256k1_pubkey *enckey
              ,uchar *msg32,secp256k1_nonce_function_hardened_ecdsa_adaptor noncefp,void *ndata)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  size_t sStack_3a0;
  int ret;
  size_t size;
  uchar buf33 [33];
  uchar local_368 [8];
  uchar nonce32 [32];
  secp256k1_scalar n;
  secp256k1_scalar sigr;
  secp256k1_scalar sp;
  secp256k1_scalar msg;
  secp256k1_scalar sk;
  secp256k1_scalar dleq_proof_e;
  secp256k1_scalar dleq_proof_s;
  secp256k1_ge enckey_ge;
  secp256k1_ge rp;
  secp256k1_ge r;
  secp256k1_gej rpj;
  secp256k1_gej rj;
  secp256k1_scalar k;
  secp256k1_nonce_function_hardened_ecdsa_adaptor noncefp_local;
  uchar *msg32_local;
  secp256k1_pubkey *enckey_local;
  uchar *seckey32_local;
  uchar *adaptor_sig162_local;
  secp256k1_context *ctx_local;
  
  memset(local_368,0,0x20);
  sStack_3a0 = 0x21;
  iVar1 = secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx);
  if (iVar1 == 0) {
    secp256k1_callback_call
              (&ctx->illegal_callback,"secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)")
    ;
    ctx_local._4_4_ = 0;
  }
  else if (adaptor_sig162 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"adaptor_sig162 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (seckey32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"seckey32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (enckey == (secp256k1_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"enckey != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (msg32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"msg32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    secp256k1_scalar_clear((secp256k1_scalar *)(sk.d + 3));
    secp256k1_scalar_clear((secp256k1_scalar *)(dleq_proof_e.d + 3));
    k.d[3] = (uint64_t)noncefp;
    if (noncefp == (secp256k1_nonce_function_hardened_ecdsa_adaptor)0x0) {
      k.d[3] = (uint64_t)nonce_function_ecdsa_adaptor;
    }
    uVar2 = secp256k1_pubkey_load(ctx,(secp256k1_ge *)(dleq_proof_s.d + 3),enckey);
    uVar3 = secp256k1_eckey_pubkey_serialize
                      ((secp256k1_ge *)(dleq_proof_s.d + 3),(uchar *)&size,&stack0xfffffffffffffc60,
                       1);
    iVar1 = (*(code *)k.d[3])(local_368,msg32,seckey32,&size,"ECDSAadaptor/non",0x10,ndata);
    secp256k1_scalar_set_b32((secp256k1_scalar *)&rj.infinity,local_368,(int *)0x0);
    iVar4 = secp256k1_scalar_is_zero((secp256k1_scalar *)&rj.infinity);
    uVar2 = (uint)((iVar4 != 0 ^ 0xffU) & 1) & (uint)(iVar1 != 0) & uVar3 & uVar2 & 1;
    secp256k1_scalar_cmov
              ((secp256k1_scalar *)&rj.infinity,&secp256k1_scalar_one,
               (uint)((uVar2 != 0 ^ 0xffU) & 1));
    secp256k1_ecmult_gen
              (&ctx->ecmult_gen_ctx,(secp256k1_gej *)&r.infinity,(secp256k1_scalar *)&rj.infinity);
    secp256k1_ge_set_gej((secp256k1_ge *)&enckey_ge.infinity,(secp256k1_gej *)&r.infinity);
    secp256k1_ecmult_const
              ((secp256k1_gej *)&rpj.infinity,(secp256k1_ge *)(dleq_proof_s.d + 3),
               (secp256k1_scalar *)&rj.infinity,0x100);
    secp256k1_ge_set_gej((secp256k1_ge *)&rp.infinity,(secp256k1_gej *)&rpj.infinity);
    secp256k1_declassify(ctx,&enckey_ge.infinity,0x58);
    secp256k1_declassify(ctx,&rp.infinity,0x58);
    uVar3 = secp256k1_dleq_prove
                      (ctx,(secp256k1_scalar *)(dleq_proof_e.d + 3),(secp256k1_scalar *)(sk.d + 3),
                       (secp256k1_scalar *)&rj.infinity,(secp256k1_ge *)(dleq_proof_s.d + 3),
                       (secp256k1_ge *)&enckey_ge.infinity,(secp256k1_ge *)&rp.infinity,
                       (secp256k1_nonce_function_hardened_ecdsa_adaptor)k.d[3],ndata);
    uVar5 = secp256k1_scalar_set_b32_seckey((secp256k1_scalar *)(msg.d + 3),seckey32);
    uVar5 = uVar5 & uVar3 & uVar2;
    secp256k1_scalar_cmov
              ((secp256k1_scalar *)(msg.d + 3),&secp256k1_scalar_one,
               (uint)((uVar5 != 0 ^ 0xffU) & 1));
    secp256k1_scalar_set_b32((secp256k1_scalar *)(sp.d + 3),msg32,(int *)0x0);
    secp256k1_fe_normalize((secp256k1_fe *)&rp.infinity);
    secp256k1_fe_get_b32((uchar *)&size,(secp256k1_fe *)&rp.infinity);
    secp256k1_scalar_set_b32((secp256k1_scalar *)(n.d + 3),(uchar *)&size,(int *)0x0);
    iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)(n.d + 3));
    secp256k1_scalar_mul
              ((secp256k1_scalar *)(nonce32 + 0x18),(secp256k1_scalar *)(n.d + 3),
               (secp256k1_scalar *)(msg.d + 3));
    secp256k1_scalar_add
              ((secp256k1_scalar *)(nonce32 + 0x18),(secp256k1_scalar *)(nonce32 + 0x18),
               (secp256k1_scalar *)(sp.d + 3));
    secp256k1_scalar_inverse((secp256k1_scalar *)(sigr.d + 3),(secp256k1_scalar *)&rj.infinity);
    secp256k1_scalar_mul
              ((secp256k1_scalar *)(sigr.d + 3),(secp256k1_scalar *)(sigr.d + 3),
               (secp256k1_scalar *)(nonce32 + 0x18));
    iVar4 = secp256k1_scalar_is_zero((secp256k1_scalar *)(sigr.d + 3));
    uVar2 = secp256k1_ecdsa_adaptor_sig_serialize
                      (adaptor_sig162,(secp256k1_ge *)&rp.infinity,
                       (secp256k1_ge *)&enckey_ge.infinity,(secp256k1_scalar *)(sigr.d + 3),
                       (secp256k1_scalar *)(sk.d + 3),(secp256k1_scalar *)(dleq_proof_e.d + 3));
    ctx_local._4_4_ = uVar2 & (uint)((iVar4 != 0 ^ 0xffU) & 1) & ((iVar1 != 0 ^ 0xffU) & 1) & uVar5;
    secp256k1_memczero(adaptor_sig162,0xa2,(uint)((ctx_local._4_4_ != 0 ^ 0xffU) & 1));
    secp256k1_scalar_clear((secp256k1_scalar *)(nonce32 + 0x18));
    secp256k1_scalar_clear((secp256k1_scalar *)&rj.infinity);
    secp256k1_scalar_clear((secp256k1_scalar *)(msg.d + 3));
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ecdsa_adaptor_encrypt(const secp256k1_context* ctx, unsigned char *adaptor_sig162, unsigned char *seckey32, const secp256k1_pubkey *enckey, const unsigned char *msg32, secp256k1_nonce_function_hardened_ecdsa_adaptor noncefp, void *ndata) {
    secp256k1_scalar k;
    secp256k1_gej rj, rpj;
    secp256k1_ge r, rp;
    secp256k1_ge enckey_ge;
    secp256k1_scalar dleq_proof_s;
    secp256k1_scalar dleq_proof_e;
    secp256k1_scalar sk;
    secp256k1_scalar msg;
    secp256k1_scalar sp;
    secp256k1_scalar sigr;
    secp256k1_scalar n;
    unsigned char nonce32[32] = { 0 };
    unsigned char buf33[33];
    size_t size = 33;
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(adaptor_sig162 != NULL);
    ARG_CHECK(seckey32 != NULL);
    ARG_CHECK(enckey != NULL);
    ARG_CHECK(msg32 != NULL);

    secp256k1_scalar_clear(&dleq_proof_e);
    secp256k1_scalar_clear(&dleq_proof_s);

    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_ecdsa_adaptor;
    }

    ret &= secp256k1_pubkey_load(ctx, &enckey_ge, enckey);
    ret &= secp256k1_eckey_pubkey_serialize(&enckey_ge, buf33, &size, 1);
    ret &= !!noncefp(nonce32, msg32, seckey32, buf33, ecdsa_adaptor_algo, sizeof(ecdsa_adaptor_algo), ndata);
    secp256k1_scalar_set_b32(&k, nonce32, NULL);
    ret &= !secp256k1_scalar_is_zero(&k);
    secp256k1_scalar_cmov(&k, &secp256k1_scalar_one, !ret);

    /* R' := k*G */
    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &rpj, &k);
    secp256k1_ge_set_gej(&rp, &rpj);
    /* R = k*Y; */
    secp256k1_ecmult_const(&rj, &enckey_ge, &k, 256);
    secp256k1_ge_set_gej(&r, &rj);
    /* We declassify the non-secret values rp and r to allow using them
     * as branch points. */
    secp256k1_declassify(ctx, &rp, sizeof(rp));
    secp256k1_declassify(ctx, &r, sizeof(r));

    /* dleq_proof = DLEQ_prove(k, (R', Y, R)) */
    ret &= secp256k1_dleq_prove(ctx, &dleq_proof_s, &dleq_proof_e, &k, &enckey_ge, &rp, &r, noncefp, ndata);

    ret &= secp256k1_scalar_set_b32_seckey(&sk, seckey32);
    secp256k1_scalar_cmov(&sk, &secp256k1_scalar_one, !ret);
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    secp256k1_fe_normalize(&r.x);
    secp256k1_fe_get_b32(buf33, &r.x);
    secp256k1_scalar_set_b32(&sigr, buf33, NULL);
    ret &= !secp256k1_scalar_is_zero(&sigr);
    /* s' = k⁻¹(m + R.x * x) */
    secp256k1_scalar_mul(&n, &sigr, &sk);
    secp256k1_scalar_add(&n, &n, &msg);
    secp256k1_scalar_inverse(&sp, &k);
    secp256k1_scalar_mul(&sp, &sp, &n);
    ret &= !secp256k1_scalar_is_zero(&sp);

    /* return (R, R', s', dleq_proof) */
    ret &= secp256k1_ecdsa_adaptor_sig_serialize(adaptor_sig162, &r, &rp, &sp, &dleq_proof_e, &dleq_proof_s);

    secp256k1_memczero(adaptor_sig162, 162, !ret);
    secp256k1_scalar_clear(&n);
    secp256k1_scalar_clear(&k);
    secp256k1_scalar_clear(&sk);

    return ret;
}